

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall clique_t::clique_t(clique_t *this,index_t _vertex)

{
  index_t local_18;
  index_t _vertex_local;
  clique_t *this_local;
  
  local_18 = _vertex;
  _vertex_local = (index_t)this;
  std::vector<long,_std::allocator<long>_>::vector(&this->faces);
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices);
  this->location = local_18;
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::unordered_map(&this->cofaces);
  std::vector<long,_std::allocator<long>_>::push_back(&this->vertices,&local_18);
  std::vector<long,_std::allocator<long>_>::push_back(&this->faces,&local_18);
  return;
}

Assistant:

clique_t(index_t _vertex) : location(_vertex) {vertices.push_back(_vertex);faces.push_back(_vertex);}